

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O1

void __thiscall
license::hw_identifier::HwIdentifier::set_identification_strategy
          (HwIdentifier *this,LCC_API_HW_IDENTIFICATION_STRATEGY strategy)

{
  logic_error *this_00;
  
  if ((uint)strategy < 0xfffffffe) {
    (this->m_data)._M_elems[1] = (char)strategy << 5 | (this->m_data)._M_elems[1] & 0x1f;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Only known strategies are permitted");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void HwIdentifier::set_identification_strategy(LCC_API_HW_IDENTIFICATION_STRATEGY strategy) {
	if (strategy == STRATEGY_NONE || strategy == STRATEGY_DEFAULT) {
		throw logic_error("Only known strategies are permitted");
	}
	uint8_t stratMov = (strategy << 5);
	m_data[1] = (m_data[1] & 0x1F) | stratMov;
}